

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O3

void lj_bufx_set(SBufExt *sbx,char *p,MSize len,GCobj *ref)

{
  undefined8 *puVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (sbx->L).ptr64;
  uVar4 = uVar3 & 0xfffffffffffffff8;
  if ((uVar3 & 6) == 0) {
    puVar1 = *(undefined8 **)(uVar4 + 0x10);
    pcVar2 = sbx->b;
    uVar3 = (ulong)(uint)(*(int *)&sbx->e - (int)pcVar2);
    puVar1[2] = puVar1[2] - uVar3;
    (*(code *)*puVar1)(puVar1[1],pcVar2,uVar3,0);
  }
  (sbx->L).ptr64 = uVar4 | 3;
  sbx->b = p;
  sbx->r = p;
  sbx->e = p + len;
  sbx->w = p + len;
  sbx->field_4 = (anon_union_8_2_d9f1b0d6_for_SBufExt_4)ref;
  if ((((ref->gch).marked & 3) != 0) && (((ulong)sbx[-1].field_4 & 4) != 0)) {
    lj_gc_barrierf(*(global_State **)(uVar4 + 0x10),(GCobj *)&sbx[-1].L,ref);
    return;
  }
  return;
}

Assistant:

void lj_bufx_set(SBufExt *sbx, const char *p, MSize len, GCobj *ref)
{
  lua_State *L = sbufL(sbx);
  lj_bufx_free(L, sbx);
  lj_bufx_set_cow(L, sbx, p, len);
  setgcref(sbx->cowref, ref);
  lj_gc_objbarrier(L, (GCudata *)sbx - 1, ref);
}